

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archivable_dictionary.cpp
# Opt level: O0

DictionaryEntry * DictionaryEntry::CreateInstance(DictionaryEntryType item_type)

{
  Entry<ON_MeshParameters> *pEStack_10;
  DictionaryEntryType item_type_local;
  
  switch(item_type) {
  case Boolean:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0x10);
    Entry<bool>::Entry((Entry<bool> *)pEStack_10);
    break;
  case UInt8:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0x10);
    Entry<unsigned_char>::Entry((Entry<unsigned_char> *)pEStack_10);
    break;
  case Int8:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0x10);
    Entry<signed_char>::Entry((Entry<signed_char> *)pEStack_10);
    break;
  case Int16:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0x10);
    Entry<short>::Entry((Entry<short> *)pEStack_10);
    break;
  case UInt16:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0x10);
    Entry<unsigned_short>::Entry((Entry<unsigned_short> *)pEStack_10);
    break;
  case Int32:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0x10);
    Entry<int>::Entry((Entry<int> *)pEStack_10);
    break;
  case UInt32:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0x10);
    Entry<unsigned_int>::Entry((Entry<unsigned_int> *)pEStack_10);
    break;
  case Int64:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0x10);
    Entry<long>::Entry((Entry<long> *)pEStack_10);
    break;
  case Float:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0x10);
    Entry<float>::Entry((Entry<float> *)pEStack_10);
    break;
  case Double:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0x10);
    Entry<double>::Entry((Entry<double> *)pEStack_10);
    break;
  case Uuid:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0x18);
    Entry<ON_UUID_struct>::Entry((Entry<ON_UUID_struct> *)pEStack_10);
    break;
  case String:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0x10);
    Entry<ON_wString>::Entry((Entry<ON_wString> *)pEStack_10);
    break;
  case BooleanArray:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0x20);
    Entry<ON_SimpleArray<bool>_>::Entry((Entry<ON_SimpleArray<bool>_> *)pEStack_10);
    break;
  case UInt8Array:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0x20);
    Entry<ON_SimpleArray<unsigned_char>_>::Entry
              ((Entry<ON_SimpleArray<unsigned_char>_> *)pEStack_10);
    break;
  case Int8Array:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0x20);
    Entry<ON_SimpleArray<signed_char>_>::Entry((Entry<ON_SimpleArray<signed_char>_> *)pEStack_10);
    break;
  case Int16Array:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0x20);
    Entry<ON_SimpleArray<short>_>::Entry((Entry<ON_SimpleArray<short>_> *)pEStack_10);
    break;
  case Int32Array:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0x20);
    Entry<ON_SimpleArray<int>_>::Entry((Entry<ON_SimpleArray<int>_> *)pEStack_10);
    break;
  case FloatArray:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0x20);
    Entry<ON_SimpleArray<float>_>::Entry((Entry<ON_SimpleArray<float>_> *)pEStack_10);
    break;
  case DoubleArray:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0x20);
    Entry<ON_SimpleArray<double>_>::Entry((Entry<ON_SimpleArray<double>_> *)pEStack_10);
    break;
  case UuidArray:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0x20);
    Entry<ON_SimpleArray<ON_UUID_struct>_>::Entry
              ((Entry<ON_SimpleArray<ON_UUID_struct>_> *)pEStack_10);
    break;
  case StringArray:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0x20);
    Entry<ON_ClassArray<ON_wString>_>::Entry((Entry<ON_ClassArray<ON_wString>_> *)pEStack_10);
    break;
  case Color:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0x10);
    Entry<ON_Color>::Entry((Entry<ON_Color> *)pEStack_10);
    break;
  case Point2i:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0x10);
    Entry<ON_2iPoint>::Entry((Entry<ON_2iPoint> *)pEStack_10);
    break;
  case Point2f:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0x10);
    Entry<ON_2fPoint>::Entry((Entry<ON_2fPoint> *)pEStack_10);
    break;
  case Rect4i:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0x18);
    Entry<ON_4iRect>::Entry((Entry<ON_4iRect> *)pEStack_10);
    break;
  default:
    pEStack_10 = (Entry<ON_MeshParameters> *)0x0;
    break;
  case Size2i:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0x10);
    Entry<ON_2iSize>::Entry((Entry<ON_2iSize> *)pEStack_10);
    break;
  case Point2d:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0x18);
    Entry<ON_2dPoint>::Entry((Entry<ON_2dPoint> *)pEStack_10);
    break;
  case Point3d:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0x20);
    Entry<ON_3dPoint>::Entry((Entry<ON_3dPoint> *)pEStack_10);
    break;
  case Point4d:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0x28);
    Entry<ON_4dPoint>::Entry((Entry<ON_4dPoint> *)pEStack_10);
    break;
  case Vector2d:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0x18);
    Entry<ON_2dVector>::Entry((Entry<ON_2dVector> *)pEStack_10);
    break;
  case Vector3d:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0x20);
    Entry<ON_3dVector>::Entry((Entry<ON_3dVector> *)pEStack_10);
    break;
  case ArchivableDictionary:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0x18);
    Entry<std::shared_ptr<ON_ArchivableDictionary>_>::Entry
              ((Entry<std::shared_ptr<ON_ArchivableDictionary>_> *)pEStack_10);
    break;
  case Object:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0x18);
    Entry<ON_Object>::Entry((Entry<ON_Object> *)pEStack_10);
    break;
  case MeshParameters:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0xe8);
    Entry<ON_MeshParameters>::Entry(pEStack_10);
    break;
  case Geometry:
    pEStack_10 = (Entry<ON_MeshParameters> *)operator_new(0x18);
    Entry<ON_Geometry>::Entry((Entry<ON_Geometry> *)pEStack_10);
  }
  return (DictionaryEntry *)pEStack_10;
}

Assistant:

DictionaryEntry* DictionaryEntry::CreateInstance(enum DictionaryEntryType item_type)
{
  switch (item_type)
  {
  // some basic data types
  case Entry<bool>::Type: return new Entry<bool>;
  case Entry<std::uint8_t>::Type: return new Entry<std::uint8_t>;
  case Entry<std::int8_t>::Type: return new Entry<std::int8_t>;
  case Entry<std::int16_t>::Type: return new Entry<std::int16_t>;
  case Entry<std::uint16_t>::Type: return new Entry<std::uint16_t>;
  case Entry<std::int32_t>::Type: return new Entry<std::int32_t>;
  case Entry<std::uint32_t>::Type: return new Entry<std::uint32_t>;
  case Entry<std::int64_t>::Type: return new Entry<std::int64_t>;
  case Entry<float>::Type: return new Entry<float>;
  case Entry<double>::Type: return new Entry<double>;
  case Entry<ON_UUID>::Type: return new Entry<ON_UUID>;
  case Entry<ON_wString>::Type: return new Entry<ON_wString>;

  // array of basic data types
  case Entry<ON_SimpleArray<bool>>::Type: return new Entry<ON_SimpleArray<bool>>;
  case Entry<ON_SimpleArray<std::uint8_t>>::Type: return new Entry<ON_SimpleArray<std::uint8_t>>;
  case Entry<ON_SimpleArray<std::int8_t>>::Type: return new Entry<ON_SimpleArray<std::int8_t>>;
  case Entry<ON_SimpleArray<std::int16_t>>::Type: return new Entry<ON_SimpleArray<std::int16_t>>;
  case Entry<ON_SimpleArray<std::int32_t>>::Type: return new Entry<ON_SimpleArray<std::int32_t>>;
  case Entry<ON_SimpleArray<float>>::Type: return new Entry<ON_SimpleArray<float>>;
  case Entry<ON_SimpleArray<double>>::Type: return new Entry<ON_SimpleArray<double>>;
  case Entry<ON_SimpleArray<ON_UUID>>::Type: return new Entry<ON_SimpleArray<ON_UUID>>;
  case Entry<ON_ClassArray<ON_wString>>::Type: return new Entry<ON_ClassArray<ON_wString>>;

  case Entry<ON_Color>::Type: return new Entry<ON_Color>;
  case Entry<ON_2iPoint>::Type: return new Entry<ON_2iPoint>;
  case Entry<ON_2fPoint>::Type: return new Entry<ON_2fPoint>;
  case Entry<ON_4iRect>::Type: return new Entry<ON_4iRect>;
  //case Entry<ON_4fRect>::Type: return new Entry<ON_4fRect>;
  case Entry<ON_2iSize>::Type: return new Entry<ON_2iSize>;
  //case Entry<ON_2fSize>::Type: return new Entry<ON_2fSize>;
  //case Entry<ON_Font>::Type: return new Entry<ON_Font>;

  //case Entry<ON_Interval>::Type: return new Entry<ON_Interval>;
  case Entry<ON_2dPoint>::Type: return new Entry<ON_2dPoint>;
  case Entry<ON_3dPoint>::Type: return new Entry<ON_3dPoint>;
  case Entry<ON_4dPoint>::Type: return new Entry<ON_4dPoint>;
  case Entry<ON_2dVector>::Type: return new Entry<ON_2dVector>;
  case Entry<ON_3dVector>::Type: return new Entry<ON_3dVector>;
  //case Entry<ON_BoundingBox>::Type: return new Entry<ON_BoundingBox>;
  //case Entry<ON_3dRay>::Type: return new Entry<ON_3dRay>;
  //case Entry<ON_PlaneEquation>::Type: return new Entry<ON_PlaneEquation>;
  //case Entry<ON_Xform>::Type: return new Entry<ON_Xform>;
  //case Entry<ON_Plane>::Type: return new Entry<ON_Plane>;
  //case Entry<ON_Line>::Type: return new Entry<ON_Line>;
  //case Entry<ON_3fPoint>::Type: return new Entry<ON_3fPoint>;
  //case Entry<ON_3fVector>::Type: return new Entry<ON_3fVector>;

  case DictionaryEntryType::Object: return new Entry<ON_Object>;
  case DictionaryEntryType::MeshParameters: return new Entry<ON_MeshParameters>;
  case DictionaryEntryType::Geometry: return new Entry<ON_Geometry>;
  case DictionaryEntryType::ArchivableDictionary: return new Entry<ON_ArchivableDictionaryPtr>;
  default: return nullptr;
  }
}